

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlEntityPtr xmlLookupGeneralEntity(xmlParserCtxtPtr ctxt,xmlChar *name,int inAttr)

{
  getEntitySAXFunc p_Var1;
  int iVar2;
  xmlEntityPtr pxVar3;
  xmlParserErrors code;
  char *msg;
  
  if (((ctxt->options & 0x100000) == 0) &&
     (pxVar3 = xmlGetPredefinedEntity(name), pxVar3 != (xmlEntityPtr)0x0)) {
    return pxVar3;
  }
  if (ctxt->sax != (_xmlSAXHandler *)0x0) {
    p_Var1 = ctxt->sax->getEntity;
    if (p_Var1 == (getEntitySAXFunc)0x0) {
      pxVar3 = (xmlEntityPtr)0x0;
    }
    else {
      pxVar3 = (*p_Var1)(ctxt->userData,name);
    }
    iVar2 = ctxt->wellFormed;
    if ((iVar2 == 1) && (pxVar3 == (xmlEntityPtr)0x0)) {
      if ((ctxt->options & 0x100000) == 0) {
        iVar2 = 1;
        pxVar3 = (xmlEntityPtr)0x0;
      }
      else {
        pxVar3 = xmlGetPredefinedEntity(name);
        iVar2 = ctxt->wellFormed;
      }
    }
    if ((iVar2 == 1) && (pxVar3 == (xmlEntityPtr)0x0)) {
      if ((xmlParserCtxtPtr)ctxt->userData != ctxt) goto LAB_0013869f;
      pxVar3 = xmlSAX2GetEntity(ctxt,name);
    }
    if (pxVar3 != (xmlEntityPtr)0x0) {
      if (pxVar3->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
        msg = "Entity reference to unparsed entity %s\n";
        code = XML_ERR_UNPARSED_ENTITY;
      }
      else {
        if (inAttr == 0) {
          return pxVar3;
        }
        if (pxVar3->etype != XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
          return pxVar3;
        }
        msg = "Attribute references external entity \'%s\'\n";
        code = XML_ERR_ENTITY_IS_EXTERNAL;
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,name,(xmlChar *)0x0,
                 (xmlChar *)0x0,0,msg,name);
      return (xmlEntityPtr)0x0;
    }
  }
LAB_0013869f:
  xmlHandleUndeclaredEntity(ctxt,name);
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
xmlLookupGeneralEntity(xmlParserCtxtPtr ctxt, const xmlChar *name, int inAttr) {
    xmlEntityPtr ent = NULL;

    /*
     * Predefined entities override any extra definition
     */
    if ((ctxt->options & XML_PARSE_OLDSAX) == 0) {
        ent = xmlGetPredefinedEntity(name);
        if (ent != NULL)
            return(ent);
    }

    /*
     * Ask first SAX for entity resolution, otherwise try the
     * entities which may have stored in the parser context.
     */
    if (ctxt->sax != NULL) {
	if (ctxt->sax->getEntity != NULL)
	    ent = ctxt->sax->getEntity(ctxt->userData, name);
	if ((ctxt->wellFormed == 1 ) && (ent == NULL) &&
	    (ctxt->options & XML_PARSE_OLDSAX))
	    ent = xmlGetPredefinedEntity(name);
	if ((ctxt->wellFormed == 1 ) && (ent == NULL) &&
	    (ctxt->userData==ctxt)) {
	    ent = xmlSAX2GetEntity(ctxt, name);
	}
    }

    if (ent == NULL) {
        xmlHandleUndeclaredEntity(ctxt, name);
    }

    /*
     * [ WFC: Parsed Entity ]
     * An entity reference must not contain the name of an
     * unparsed entity
     */
    else if (ent->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_UNPARSED_ENTITY,
		 "Entity reference to unparsed entity %s\n", name);
        ent = NULL;
    }

    /*
     * [ WFC: No External Entity References ]
     * Attribute values cannot contain direct or indirect
     * entity references to external entities.
     */
    else if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
        if (inAttr) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_IS_EXTERNAL,
                 "Attribute references external entity '%s'\n", name);
            ent = NULL;
        }
    }

    return(ent);
}